

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairwise_tests.cpp
# Opt level: O2

int C_x_iutest_x_PairwiseTest_TestSuiteInstantiationRegister(void)

{
  int iVar1;
  UnitTest *pUVar2;
  ParamTestSuiteInfo<PairwiseTest> *this;
  allocator<char> local_69;
  string local_68;
  string local_48;
  string local_28;
  
  pUVar2 = iutest::UnitTest::instance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"PairwiseTest",&local_69);
  iutest::detail::package_name_server<iuTest_TestSuitePackage>::getname_abi_cxx11_();
  this = iutest::detail::ParamTestSuiteHolder::GetTestSuitePatternHolder<PairwiseTest>
                   (&pUVar2->m_param_testsuite_holder,&local_68,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"C",(allocator<char> *)&local_68);
  iVar1 = iutest::detail::ParamTestSuiteInfo<PairwiseTest>::AddTestSuiteInstantiation
                    (this,&local_48,s_C_x_iutest_x_PairwiseTest_EvalGenerator_,
                     s_C_x_iutest_x_PairwiseTest_ParamGenerator__abi_cxx11_,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pairwise_tests.cpp"
                     ,0x8b);
  std::__cxx11::string::~string((string *)&local_48);
  return iVar1;
}

Assistant:

IUTEST_P(PairwiseTest2, Num)
{
    const PairwiseTest2Tuple param = GetParam();
    mtx[::iutest::tuples::get<0>(param)][::iutest::tuples::get<1>(param)] = true;
}